

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O2

void asio::detail::
     completion_handler<asio::detail::binder2<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:90:23),_std::error_code,_unsigned_long>,_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  ptr local_50;
  binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_std::error_code,_unsigned_long>
  local_38;
  
  local_38.handler_.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)base[1].next_;
  local_38.handler_.me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[1].func_;
  base[1].func_ = (func_type)0x0;
  base[1].next_ = (scheduler_operation *)0x0;
  local_38.arg1_._M_value = base[1].task_result_;
  local_38.arg1_._4_4_ = *(undefined4 *)&base[1].field_0x14;
  local_38.arg1_._M_cat = (error_category *)base[2].next_;
  local_38.arg2_ = (unsigned_long)base[2].func_;
  local_50.h = &local_38;
  local_50.v = (completion_handler<asio::detail::binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_std::error_code,_unsigned_long>,_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)base;
  local_50.p = (completion_handler<asio::detail::binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_std::error_code,_unsigned_long>,_asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)base;
  ptr::reset(&local_50);
  if (owner != (void *)0x0) {
    binder2<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:90:23),_std::error_code,_unsigned_long>
    ::operator()(&local_38);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_38.handler_.me.
              super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ptr::~ptr(&local_50);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };

    ASIO_HANDLER_COMPLETION((*h));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        ASIO_MOVE_CAST2(handler_work<Handler, IoExecutor>)(
          h->work_));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }